

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::Image::ImageTests::ImageTests
          (ImageTests *this,EglTestContext *eglTestCtx,string *name,string *desc)

{
  long lVar1;
  
  TestCaseGroup::TestCaseGroup
            (&this->super_TestCaseGroup,eglTestCtx,(name->_M_dataplus)._M_p,(desc->_M_dataplus)._M_p
            );
  (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ImageTests_003f32a8;
  lVar1 = 0;
  do {
    *(char **)((long)&(this->m_createActions).m_actions[0].label._M_dataplus._M_p + lVar1) =
         (this->m_createActions).m_actions[0].label.field_2._M_local_buf + lVar1;
    *(undefined8 *)((long)&(this->m_createActions).m_actions[0].label._M_string_length + lVar1) = 0;
    (this->m_createActions).m_actions[0].label.field_2._M_local_buf[lVar1] = '\0';
    *(undefined8 *)
     ((long)&(this->m_createActions).m_actions[0].action.
             super_UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
             .m_data.ptr + lVar1) = 0;
    lVar1 = lVar1 + 0x30;
  } while (lVar1 != 0x600);
  (this->m_createActions).m_numActions = 0;
  return;
}

Assistant:

ImageTests						(EglTestContext& eglTestCtx, const string& name, const string& desc)
						: TestCaseGroup(eglTestCtx, name.c_str(), desc.c_str()) {}